

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePrism>::FirstShapeIndex(TPZVec<long> *Index,int *scalarorders)

{
  int iVar1;
  int iVar2;
  int iside;
  ulong uVar3;
  
  *Index->fStore = 0;
  iVar2 = 0;
  uVar3 = 0;
  do {
    iVar1 = 1;
    if (5 < uVar3) {
      iVar1 = *scalarorders;
    }
    iVar1 = pzshape::TPZShapePrism::NConnectShapeF((int)uVar3,iVar1);
    iVar2 = iVar2 + iVar1;
    Index->fStore[uVar3 + 1] = (long)iVar2;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x15);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FirstShapeIndex(TPZVec<int64_t> &Index, int &scalarorders) {
    Index[0] = 0;

    for(int iside=0;iside<TSHAPE::NSides;iside++)
    {
        int sideorder = 1;
        if (iside >= TSHAPE::NCornerNodes) {
            sideorder = scalarorders;
        }
        int temp = Index[iside] + TSHAPE::NConnectShapeF(iside,sideorder);
        Index[iside+1] = temp;
    }
}